

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeContextCreate
          (ze_driver_handle_t hDriver,ze_context_desc_t *desc,ze_context_handle_t *phContext)

{
  ze_result_t zVar1;
  
  if (DAT_0010d298 != (code *)0x0) {
    zVar1 = (*DAT_0010d298)();
    return zVar1;
  }
  context_t::get()::count = (ze_context_handle_t)((long)context_t::get()::count + 1);
  *phContext = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextCreate(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver object
        const ze_context_desc_t* desc,                  ///< [in] pointer to context descriptor
        ze_context_handle_t* phContext                  ///< [out] pointer to handle of context object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreate = context.zeDdiTable.Context.pfnCreate;
        if( nullptr != pfnCreate )
        {
            result = pfnCreate( hDriver, desc, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }